

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall pbrt::RGB::ToString_abi_cxx11_(string *__return_storage_ptr__,RGB *this)

{
  float *in_R9;
  
  StringPrintf<float_const&,float_const&,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ %f %f %f ]",(char *)this,&this->g,&this->b,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string RGB::ToString() const {
    return StringPrintf("[ %f %f %f ]", r, g, b);
}